

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

void FIX::process_sleep(double s)

{
  int iVar1;
  double local_38;
  double intpart;
  timespec remainder;
  timespec time;
  double s_local;
  
  modf(s,&local_38);
  remainder.tv_nsec = (__syscall_slong_t)(int)local_38;
  while( true ) {
    iVar1 = nanosleep((timespec *)&remainder.tv_nsec,(timespec *)&intpart);
    if (iVar1 != -1) break;
    remainder.tv_nsec = (__syscall_slong_t)intpart;
  }
  return;
}

Assistant:

void process_sleep(double s) {
#ifdef _MSC_VER
  Sleep((long)(s * 1000));
#else
  timespec time, remainder;
  double intpart;
  time.tv_nsec = (long)(modf(s, &intpart) * 1e9);
  time.tv_sec = (int)intpart;
  while (nanosleep(&time, &remainder) == -1) {
    time = remainder;
  }
#endif
}